

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O3

void __thiscall
TEST_CommandLineArguments_setGroupFilter_Test::testBody
          (TEST_CommandLineArguments_setGroupFilter_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TestFilter *pTVar4;
  TestFilter *filter;
  char *pcVar5;
  char *pcVar6;
  TestFilter TStack_88;
  undefined1 local_68 [16];
  TestFilter local_58;
  char *argv [3];
  
  argv[2] = "group";
  argv[0] = "tests.exe";
  argv[1] = "-g";
  pUVar2 = UtestShell::getCurrent();
  bVar1 = TEST_GROUP_CppUTestGroupCommandLineArguments::newArgumentParser
                    (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments,3,argv);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","newArgumentParser(argc, argv)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
             ,199,pTVar3);
  TestFilter::TestFilter(&TStack_88,"group");
  pTVar4 = CommandLineArguments::getGroupFilters
                     ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  bVar1 = TestFilter::operator!=(&TStack_88,pTVar4);
  SimpleString::~SimpleString(&TStack_88.filter_);
  if (bVar1) {
    pTVar4 = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    filter = CommandLineArguments::getGroupFilters
                       ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    bVar1 = TestFilter::operator!=(pTVar4,filter);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,200);
    }
    TestFilter::TestFilter(&TStack_88,"group");
    TestFilter::TestFilter((TestFilter *)(local_68 + 0x10),"group");
    bVar1 = TestFilter::operator!=(&TStack_88,(TestFilter *)(local_68 + 0x10));
    SimpleString::~SimpleString((SimpleString *)(local_68 + 0x10));
    SimpleString::~SimpleString(&TStack_88.filter_);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Expected Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,200);
    }
    pUVar2 = UtestShell::getCurrent();
    TestFilter::TestFilter(&TStack_88,"group");
    StringFrom((TestFilter *)(local_68 + 0x10));
    pcVar5 = SimpleString::asCharString((SimpleString *)(local_68 + 0x10));
    CommandLineArguments::getGroupFilters
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((TestFilter *)local_68);
    pcVar6 = SimpleString::asCharString((SimpleString *)local_68);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar5,pcVar6,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,200,pTVar3);
    SimpleString::~SimpleString((SimpleString *)local_68);
    SimpleString::~SimpleString((SimpleString *)(local_68 + 0x10));
    SimpleString::~SimpleString(&TStack_88.filter_);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,200,pTVar3);
  }
  return;
}

Assistant:

TEST(CommandLineArguments, setGroupFilter)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-g", "group" };
    CHECK(newArgumentParser(argc, argv));
    CHECK_EQUAL(TestFilter("group"), *args->getGroupFilters());
}